

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cc
# Opt level: O2

Vector __thiscall ipx::CopyBasic(ipx *this,Vector *x,Basis *basis)

{
  uint uVar1;
  pointer piVar2;
  double *pdVar3;
  double *pdVar4;
  ulong uVar5;
  ulong uVar6;
  Vector VVar7;
  
  uVar1 = basis->model_->num_rows_;
  std::valarray<double>::valarray((valarray<double> *)this,(long)(int)uVar1);
  piVar2 = (basis->basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = x->_M_data;
  pdVar4 = *(double **)(this + 8);
  uVar5 = 0;
  uVar6 = 0;
  if (0 < (int)uVar1) {
    uVar6 = (ulong)uVar1;
  }
  for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    pdVar4[uVar5] = pdVar3[piVar2[uVar5]];
  }
  VVar7._M_data = pdVar4;
  VVar7._M_size = (size_t)this;
  return VVar7;
}

Assistant:

Vector CopyBasic(const Vector& x, const Basis& basis) {
    const Int m = basis.model().rows();
    Vector xbasic(m);
    for (Int p = 0; p < m; p++)
        xbasic[p] = x[basis[p]];
    return xbasic;
}